

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [145];
  CMUnitTest aCStack_16b8 [145];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar5 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar5 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar7 = "Prescott";
            goto LAB_00108d78;
          }
          if (uVar3 == 0x66) {
            pcVar7 = "Presler";
            goto LAB_00108d78;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar7 = "Dothan";
            goto LAB_00108d78;
          }
          if (uVar3 == 0x6f) goto switchD_00108b25_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar7 = "Pineview";
            goto LAB_00108d78;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar5 = (long)&switchD_00108b25::switchdataD_00134170 +
                  (long)(int)(&switchD_00108b25::switchdataD_00134170)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00108b25_caseD_0:
            pcVar7 = "Merom";
            goto LAB_00108d78;
          case 1:
          case 7:
            pcVar7 = "Penryn";
            goto LAB_00108d78;
          case 4:
          case 8:
switchD_00108b25_caseD_4:
            pcVar7 = "Nehalem";
            goto LAB_00108d78;
          }
        }
        else {
          uVar5 = uVar6;
          if (uVar3 == 0x266) {
            pcVar7 = "Lincroft";
            goto LAB_00108d78;
          }
          if (uVar3 == 0x366) {
            pcVar7 = "Cedarview";
            goto LAB_00108d78;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar5 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "Westmere";
          goto LAB_00108d78;
        }
        uVar5 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "SandyBridge";
          goto LAB_00108d78;
        }
        if (uVar3 == 9) goto switchD_00108b25_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_00108d78;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x30f1) goto LAB_00108d0b;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar7 = "CherryTrail";
          goto LAB_00108d78;
        }
        if (uVar3 == 0x506c) goto LAB_00108cab;
        if (uVar3 == 0x506e) {
          pcVar7 = "Skylake";
          goto LAB_00108d78;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_00108cb7:
          pcVar7 = "Icelake";
          goto LAB_00108d78;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_00108d0b:
          pcVar7 = "Zen2";
          goto LAB_00108d78;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_00108cab:
        pcVar7 = "Goldmont";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x706e) goto LAB_00108cb7;
      if (uVar3 == 0x70f1) goto LAB_00108d0b;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x806e) {
LAB_00108d1b:
        pcVar7 = "Kabylake";
        goto LAB_00108d78;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar7 = "Alderlake";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x906e) goto LAB_00108d1b;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_00108d78;
      }
      if (uVar3 == 0x90f0) goto LAB_00108d0b;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar7 = "Rocketlake";
      goto LAB_00108d78;
    }
    if (uVar3 == 0xb067) {
      pcVar7 = "Raptorlake";
      goto LAB_00108d78;
    }
    if (uVar3 == 0x20f10) goto LAB_00108cc3;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar7 = "Zen3+";
      goto LAB_00108d78;
    }
    if (uVar3 == 0x50f00) {
LAB_00108cc3:
      pcVar7 = "Zen3";
      goto LAB_00108d78;
    }
    if (uVar3 == 0x60f10) {
      pcVar7 = "Zen4";
      goto LAB_00108d78;
    }
  }
  pcVar7 = "unknown";
LAB_00108d78:
  printf("x64 processor:  %s\t",pcVar7,(ulong)puVar1[2],uVar5);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar2 + 0xc),
           (ulong)*(uint *)(lVar2 + 8));
  }
  memcpy(aCStack_16b8,&PTR_anon_var_dwarf_69f_00149730,0x16a8);
  iVar4 = _cmocka_run_group_tests
                    ("tests",aCStack_16b8,0x91,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar4;
}

Assistant:

int main() {
    tellmeall();

    const struct CMUnitTest tests[] = {
        cmocka_unit_test(PyRoaringBitMap124),
        cmocka_unit_test(fuzz_deserializer),
        cmocka_unit_test(issue660),
        cmocka_unit_test(issue538b),
        cmocka_unit_test(issue538),
        cmocka_unit_test(simple_roaring_bitmap_or_many),
        cmocka_unit_test(robust_deserialization),
        cmocka_unit_test(issue457),
        cmocka_unit_test(convert_to_bitset),
        cmocka_unit_test(issue440),
        cmocka_unit_test(issue436),
        cmocka_unit_test(issue433),
        cmocka_unit_test(issue429),
        cmocka_unit_test(issue431),
        cmocka_unit_test(test_contains_range_PyRoaringBitMap_issue81),
        cmocka_unit_test(issue316),
        cmocka_unit_test(issue288),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(issue245),
#endif
        cmocka_unit_test(issue208),
        cmocka_unit_test(issue208b),
        cmocka_unit_test(range_contains),
        cmocka_unit_test(contains_bulk),
        cmocka_unit_test(inplaceorwide),
        cmocka_unit_test(test_contains_range),
        cmocka_unit_test(check_range_contains_from_end),
        cmocka_unit_test(check_iterate_to_end),
        cmocka_unit_test(check_iterate_to_beginning),
        cmocka_unit_test(test_iterator_reuse),
        cmocka_unit_test(check_full_flip),
        cmocka_unit_test(test_adversarial_range),
        cmocka_unit_test(check_full_inplace_flip),
        cmocka_unit_test(test_stress_memory_true),
        cmocka_unit_test(test_stress_memory_false),
        cmocka_unit_test(check_interval),
        cmocka_unit_test(test_uint32_iterator_true),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_example_true),
        cmocka_unit_test(test_example_false),
#endif
        cmocka_unit_test(test_clear),
        cmocka_unit_test(can_copy_empty_true),
        cmocka_unit_test(can_copy_empty_false),
        cmocka_unit_test(test_intersect_small_run_bitset),
        cmocka_unit_test(is_really_empty),
        cmocka_unit_test(test_rank),
        cmocka_unit_test(test_get_index),
        cmocka_unit_test(test_maximum_minimum),
        cmocka_unit_test(test_stats),
        cmocka_unit_test(test_addremove),
        cmocka_unit_test(test_addremove_bulk),
        cmocka_unit_test(test_addremoverun),
        cmocka_unit_test(test_basic_add),
        cmocka_unit_test(test_remove_withrun),
        cmocka_unit_test(test_remove_from_copies_true),
        cmocka_unit_test(test_remove_from_copies_false),
        cmocka_unit_test(test_range_and_serialize),
        cmocka_unit_test(test_silly_range),
        cmocka_unit_test(test_uint32_iterator_true),
        cmocka_unit_test(test_uint32_iterator_false),
        cmocka_unit_test(with_huge_capacity),
        cmocka_unit_test(leaks_with_empty_true),
        cmocka_unit_test(leaks_with_empty_false),
        cmocka_unit_test(test_bitmap_from_range),
        cmocka_unit_test(test_printf),
        cmocka_unit_test(test_printf_withbitmap),
        cmocka_unit_test(test_printf_withrun),
        cmocka_unit_test(test_iterate),
        cmocka_unit_test(test_iterate_empty),
        cmocka_unit_test(test_iterate_withbitmap),
        cmocka_unit_test(test_iterate_withrun),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_serialize),
        cmocka_unit_test(test_portable_serialize),
#endif
        cmocka_unit_test(test_add),
        cmocka_unit_test(test_add_checked),
        cmocka_unit_test(test_remove_checked),
        cmocka_unit_test(test_contains),
        cmocka_unit_test(test_intersection_array_x_array),
        cmocka_unit_test(test_intersection_array_x_array_inplace),
        cmocka_unit_test(test_intersection_bitset_x_bitset),
        cmocka_unit_test(test_intersection_bitset_x_bitset_inplace),
        cmocka_unit_test(test_union_true),
        cmocka_unit_test(test_union_false),
        cmocka_unit_test(test_xor_false),
        cmocka_unit_test(test_xor_inplace_false),
        cmocka_unit_test(test_xor_lazy_false),
        cmocka_unit_test(test_xor_lazy_inplace_false),
        cmocka_unit_test(test_xor_true),
        cmocka_unit_test(test_xor_inplace_true),
        cmocka_unit_test(test_xor_lazy_true),
        cmocka_unit_test(test_xor_lazy_inplace_true),
        cmocka_unit_test(test_andnot_false),
        cmocka_unit_test(test_andnot_inplace_false),
        cmocka_unit_test(test_andnot_true),
        cmocka_unit_test(test_andnot_inplace_true),
        cmocka_unit_test(test_conversion_to_int_array),
        cmocka_unit_test(test_array_to_run),
        cmocka_unit_test(test_array_to_self),
        cmocka_unit_test(test_bitset_to_self),
        cmocka_unit_test(test_bitset_to_run),
        cmocka_unit_test(test_conversion_to_int_array_with_runoptimize),
        cmocka_unit_test(test_run_to_self),
        cmocka_unit_test(test_remove_run_to_bitset_cow),
        cmocka_unit_test(test_remove_run_to_array_cow),
        cmocka_unit_test(test_remove_run_to_bitset),
        cmocka_unit_test(test_remove_run_to_array),
        cmocka_unit_test(test_negation_array0),
        cmocka_unit_test(test_negation_array1),
        cmocka_unit_test(test_negation_array2),
        cmocka_unit_test(test_negation_bitset1),
        cmocka_unit_test(test_negation_bitset2),
        cmocka_unit_test(test_negation_run1),
        cmocka_unit_test(test_negation_run2),
        cmocka_unit_test(test_rand_flips),
        cmocka_unit_test(test_inplace_negation_array0),
        cmocka_unit_test(test_inplace_negation_array1),
        cmocka_unit_test(test_inplace_negation_array2),
        cmocka_unit_test(test_inplace_negation_bitset1),
        cmocka_unit_test(test_inplace_negation_bitset2),
        cmocka_unit_test(test_inplace_negation_run1),
        cmocka_unit_test(test_inplace_negation_run2),
        cmocka_unit_test(test_inplace_rand_flips),
        cmocka_unit_test(test_flip_array_container_removal),
        cmocka_unit_test(test_flip_bitset_container_removal),
        cmocka_unit_test(test_flip_run_container_removal),
        cmocka_unit_test(test_flip_run_container_removal2),
        cmocka_unit_test(select_test),
        cmocka_unit_test(test_subset),
        cmocka_unit_test(test_or_many_memory_leak),
        // cmocka_unit_test(test_run_to_bitset),
        // cmocka_unit_test(test_run_to_array),
        cmocka_unit_test(test_read_uint32_iterator_array),
        cmocka_unit_test(test_read_uint32_iterator_bitset),
        cmocka_unit_test(test_read_uint32_iterator_run),
        cmocka_unit_test(test_read_uint32_iterator_native),
        cmocka_unit_test(test_previous_iterator_array),
        cmocka_unit_test(test_previous_iterator_bitset),
        cmocka_unit_test(test_previous_iterator_run),
        cmocka_unit_test(test_previous_iterator_native),
        cmocka_unit_test(test_iterator_reuse),
        cmocka_unit_test(test_iterator_reuse_many),
        cmocka_unit_test(read_uint32_iterator_zero_count),
        cmocka_unit_test(test_add_range),
        cmocka_unit_test(test_remove_range),
        cmocka_unit_test(test_remove_many),
        cmocka_unit_test(test_range_cardinality),
#if !CROARING_IS_BIG_ENDIAN
        cmocka_unit_test(test_frozen_serialization),
        cmocka_unit_test(test_frozen_serialization_max_containers),
        cmocka_unit_test(test_portable_deserialize_frozen),
        cmocka_unit_test(issue_15jan2024),
#endif
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}